

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::contains
          (SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this,uint *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint in_R9D;
  
  uVar1 = this->bucketCount;
  uVar3 = *key * -0x61c88647;
  uVar2 = 0;
  do {
    bVar4 = (byte)in_R9D;
    if (uVar1 == uVar2) {
LAB_001aa06a:
      return (bool)(uVar2 < uVar1 & bVar4);
    }
    uVar3 = uVar3 & uVar1 - 1;
    in_R9D = this->data[uVar3];
    if (in_R9D == 0) {
      bVar4 = 0;
      goto LAB_001aa06a;
    }
    if (in_R9D == *key) {
      bVar4 = 1;
      goto LAB_001aa06a;
    }
    uVar3 = uVar3 + uVar2 + 1;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}